

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O3

Var Js::JavascriptObject::EntryAssign(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  uint idxArg;
  int in_stack_00000010;
  CallInfo local_48;
  CallInfo callInfo_local;
  ArgumentReader args;
  RecyclableObject *to;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_48 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x624,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00ce46e3;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  callInfo_local = callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_48);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_48 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x627,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00ce46e3:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  args.super_Arguments.Values = (Type)0x0;
  if ((callInfo_local._0_4_ & 0xffffff) != 1) {
    pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1);
    BVar4 = JavascriptConversion::ToObject
                      (pvVar6,pSVar1,(RecyclableObject **)&args.super_Arguments.Values);
    if (BVar4 != 0) {
      if (2 < (callInfo_local._0_4_ & 0xffffff)) {
        pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,2);
        CopyDataPropertiesHelper<true,true>
                  (pvVar6,(RecyclableObject *)args.super_Arguments.Values,pSVar1,
                   (BVSparse<Memory::Recycler> *)0x0);
        if (((ulong)callInfo_local & 0xfffffc) != 0) {
          idxArg = 3;
          do {
            pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,idxArg);
            CopyDataPropertiesHelper<false,true>
                      (pvVar6,(RecyclableObject *)args.super_Arguments.Values,pSVar1,
                       (BVSparse<Memory::Recycler> *)0x0);
            idxArg = idxArg + 1;
          } while (idxArg < (callInfo_local._0_4_ & 0xffffff));
        }
      }
      return args.super_Arguments.Values;
    }
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec36,L"Object.assign");
}

Assistant:

Var JavascriptObject::EntryAssign(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    // 1. Let to be ToObject(target).
    // 2. ReturnIfAbrupt(to).
    // 3  If only one argument was passed, return to.
    RecyclableObject* to = nullptr;
    if (args.Info.Count == 1 || !JavascriptConversion::ToObject(args[1], scriptContext, &to))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("Object.assign"));
    }

    if (args.Info.Count < 3)
    {
        return to;
    }

    // 4. Let sources be the List of argument values starting with the second argument.
    // 5. For each element nextSource of sources, in ascending index order,
    CopyDataPropertiesHelper<true, true>(args[2], to, scriptContext);
    for (unsigned int i = 3; i < args.Info.Count; i++)
    {
        CopyDataPropertiesHelper<false, true>(args[i], to, scriptContext);
    }

    // 6. Return to.
    return to;
}